

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O0

void lts2::ProxLinf(Mat *X,float radius)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  double dVar4;
  int local_5c;
  float abs_x;
  int x;
  float *p_x;
  int y;
  allocator local_39;
  string local_38 [36];
  float local_14;
  Mat *pMStack_10;
  float radius_local;
  Mat *X_local;
  
  local_14 = radius;
  pMStack_10 = X;
  if ((*(long *)(X + 0x10) != 0) && (iVar1 = cv::Mat::depth(X), iVar1 == 5)) {
    for (p_x._0_4_ = 0; (int)p_x < *(int *)(pMStack_10 + 8); p_x._0_4_ = (int)p_x + 1) {
      _abs_x = cv::Mat::ptr<float>(pMStack_10,(int)p_x);
      for (local_5c = 0; iVar1 = *(int *)(pMStack_10 + 0xc), iVar2 = cv::Mat::channels(pMStack_10),
          local_5c < iVar1 * iVar2; local_5c = local_5c + 1) {
        dVar4 = std::fabs((double)(ulong)(uint)*_abs_x);
        if (local_14 < SUB84(dVar4,0)) {
          if (*_abs_x <= 0.0) {
            *_abs_x = -local_14;
          }
          else {
            *_abs_x = local_14;
          }
        }
        _abs_x = _abs_x + 1;
      }
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"X.data && X.depth() == CV_32F",&local_39);
  uVar3 = cv::error(-0xd7,local_38,"ProxLinf",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/prox.cpp"
                    ,0x31);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  _Unwind_Resume(uVar3);
}

Assistant:

void lts2::ProxLinf(cv::Mat& X, float radius)
{
  CV_Assert(X.data && X.depth() == CV_32F);

#ifdef WITH_DISPATCH
  // Get a queue
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);

  // Parallel loop over the rows
  float* p_imageData = X.ptr<float>(0);

  dispatch_apply(X.rows, queue,
                 ^(size_t y) {
                   float *p_x = X.ptr<float>(y);
                   
                   for (int x = 0; x < X.channels()*X.cols; ++x, ++p_x) {
                     if (std::fabs(*p_x) > radius) {
                       if (*p_x > 0.0)
                         *p_x = radius;
                       else
                         *p_x = -radius;
                     }
                   }
                 });    
#else
  for (int y = 0; y < X.rows; ++y)
  {
    float* p_x = X.ptr<float>(y);
    
    for (int x = 0; x < X.cols*X.channels(); ++x, ++p_x)
    {
      float abs_x = std::fabs(*p_x);
      if (abs_x > radius) {
        if (*p_x > 0.0) 
          *p_x = radius;
        else
        *p_x = -radius;
      }
    }
  }
#endif
}